

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restarts.cc
# Opt level: O3

void __thiscall
gss::LubyRestartsSchedule::LubyRestartsSchedule
          (LubyRestartsSchedule *this,LubyRestartsSchedule *other)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  long lVar3;
  _List_node_base *p_Var4;
  
  (this->super_RestartsSchedule)._vptr_RestartsSchedule =
       (_func_int **)&PTR__LubyRestartsSchedule_001e3218;
  this->_backtracks_remaining = other->_backtracks_remaining;
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::list
            (&this->_sequence,&other->_sequence);
  p_Var2 = (this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node
           .super__List_node_base._M_next;
  (this->_current_sequence)._M_node = p_Var2;
  p_Var4 = (other->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  p_Var1 = (other->_current_sequence)._M_node;
  if (p_Var4 != p_Var1) {
    lVar3 = 0;
    do {
      p_Var4 = p_Var4->_M_next;
      lVar3 = lVar3 + -1;
    } while (p_Var4 != p_Var1);
    do {
      p_Var2 = p_Var2->_M_next;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
    (this->_current_sequence)._M_node = p_Var2;
  }
  return;
}

Assistant:

LubyRestartsSchedule::LubyRestartsSchedule(const LubyRestartsSchedule & other) :
    _backtracks_remaining(other._backtracks_remaining),
    _sequence(other._sequence),
    _current_sequence(_sequence.begin())
{
    advance(_current_sequence, distance(other._sequence.begin(), other._current_sequence));
}